

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devicehandlerlist_p.h
# Opt level: O0

int __thiscall
QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::remove
          (DeviceHandlerList<QEvdevTouchScreenHandlerThread> *this,char *__filename)

{
  long lVar1;
  __normal_iterator<const_QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device_*,_std::vector<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device>_>_>
  __first;
  bool bVar2;
  long in_FS_OFFSET;
  __normal_iterator<const_QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device_*,_std::vector<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device>_>_>
  it;
  anon_class_8_1_cc056f36_for__M_pred deviceNodeMatches;
  __normal_iterator<const_QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device_*,_std::vector<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device>_>_>
  *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  __normal_iterator<const_QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device_*,_std::vector<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device>_>_>
  __last;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __last._M_current = (Device *)this;
  std::
  vector<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device>_>
  ::cbegin((vector<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device>_>
            *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  std::
  vector<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device>_>
  ::cend((vector<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device>_>
          *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  __first._M_current._7_1_ = in_stack_ffffffffffffffcf;
  __first._M_current._0_7_ = in_stack_ffffffffffffffc8;
  std::
  find_if<__gnu_cxx::__normal_iterator<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device_const*,std::vector<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device,std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device>>>,QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::remove(QString_const&)::_lambda(QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device_const&)_1_>
            (__first,__last,(anon_class_8_1_cc056f36_for__M_pred)__filename);
  std::
  vector<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device>_>
  ::cend((vector<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device>_>
          *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  bVar2 = __gnu_cxx::operator==
                    ((__normal_iterator<const_QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device_*,_std::vector<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff88);
  if (!bVar2) {
    std::
    vector<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device>_>
    ::erase(&this->v,(const_iterator)__filename);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (int)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),!bVar2);
}

Assistant:

bool remove(const QString &deviceNode)
    {
        const auto deviceNodeMatches = [&] (const Device &d) { return d.deviceNode == deviceNode; };
        const auto it = std::find_if(v.cbegin(), v.cend(), deviceNodeMatches);
        if (it == v.cend())
            return false;
        v.erase(it);
        return true;
    }